

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteTargets(cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  pointer ppcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  undefined4 extraout_var;
  cmGlobalGhsMultiGenerator *pcVar7;
  cmGeneratorTarget **tgt;
  pointer ppcVar8;
  pointer ppcVar9;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  string rootBinaryDir;
  cmAlphaNum local_358;
  string fname;
  string name;
  cmAlphaNum local_2e8;
  string local_2b8;
  cmGeneratedFileStream fbld;
  
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
  std::__cxx11::string::string((string *)&rootBinaryDir,(string *)psVar6);
  ppcVar9 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppcVar9 == ppcVar1) {
      std::__cxx11::string::~string((string *)&rootBinaryDir);
      return;
    }
    this_00 = *ppcVar9;
    TVar4 = cmGeneratorTarget::GetType(this_00);
    if (((TVar4 != INTERFACE_LIBRARY) &&
        (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 != MODULE_LIBRARY)) &&
       (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 != SHARED_LIBRARY)) {
      TVar4 = cmGeneratorTarget::GetType(this_00);
      if (TVar4 == GLOBAL_TARGET) {
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        iVar5 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1a])();
        bVar3 = std::operator!=(psVar6,(char *)CONCAT44(extraout_var,iVar5));
        if (bVar3) goto LAB_002ac503;
      }
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      fbld.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           (psVar6->_M_dataplus)._M_p;
      fbld.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)psVar6->_M_string_length;
      local_358.View_._M_len = 4;
      local_358.View_._M_str = ".tgt";
      cmStrCat<char_const*>(&name,(cmAlphaNum *)&fbld,&local_358,&FILE_EXTENSION);
      fbld.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)rootBinaryDir._M_string_length;
      fbld.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           rootBinaryDir._M_dataplus._M_p;
      local_358.View_._M_len = 1;
      local_358.View_._M_str = "/";
      cmStrCat<std::__cxx11::string>(&fname,(cmAlphaNum *)&fbld,&local_358,&name);
      cmGeneratedFileStream::cmGeneratedFileStream(&fbld,&fname,false,None);
      pcVar7 = (cmGlobalGhsMultiGenerator *)&fbld;
      cmGeneratedFileStream::SetCopyIfDifferent(&fbld,true);
      WriteFileHeader(pcVar7,(ostream *)&fbld);
      GhsMultiGpj::WriteGpjTag(PROJECT,(ostream *)&fbld);
      build.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      build.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      build.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar7 = this;
      bVar3 = ComputeTargetBuildOrder(this,this_00,&build);
      ppcVar2 = build.
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppcVar8 = build.
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (bVar3) {
        local_358.View_._M_len = 0x2e;
        local_358.View_._M_str = "The inter-target dependency graph for target [";
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        local_2e8.View_._M_str = (psVar6->_M_dataplus)._M_p;
        local_2e8.View_._M_len = psVar6->_M_string_length;
        cmStrCat<char[16]>(&local_2b8,&local_358,&local_2e8,(char (*) [16])"] had a cycle.\n");
        cmSystemTools::Error(&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
      }
      else {
        for (; ppcVar8 != ppcVar2; ppcVar8 = ppcVar8 + 1) {
          WriteProjectLine(pcVar7,(ostream *)&fbld,*ppcVar8,&rootBinaryDir);
        }
      }
      cmGeneratedFileStream::Close(&fbld);
      std::_Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
      ~_Vector_base(&build.
                     super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   );
      cmGeneratedFileStream::~cmGeneratedFileStream(&fbld);
      std::__cxx11::string::~string((string *)&fname);
      std::__cxx11::string::~string((string *)&name);
    }
LAB_002ac503:
    ppcVar9 = ppcVar9 + 1;
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTargets(cmLocalGenerator* root)
{
  std::string rootBinaryDir = root->GetCurrentBinaryDirectory();

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != this->GetInstallTargetName())) {
      continue;
    }

    // create target build file
    std::string name = cmStrCat(target->GetName(), ".tgt", FILE_EXTENSION);
    std::string fname = cmStrCat(rootBinaryDir, "/", name);
    cmGeneratedFileStream fbld(fname);
    fbld.SetCopyIfDifferent(true);
    this->WriteFileHeader(fbld);
    GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);
    std::vector<cmGeneratorTarget const*> build;
    if (this->ComputeTargetBuildOrder(target, build)) {
      cmSystemTools::Error(
        cmStrCat("The inter-target dependency graph for target [",
                 target->GetName(), "] had a cycle.\n"));
    } else {
      for (auto& tgt : build) {
        this->WriteProjectLine(fbld, tgt, rootBinaryDir);
      }
    }
    fbld.Close();
  }
}